

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noui.cpp
# Opt level: O0

void noui_test_redirect(void)

{
  long in_FS_OFFSET;
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  *in_stack_ffffffffffffff38;
  _func_bool_bilingual_str_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_uint
  *in_stack_ffffffffffffff40;
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  *in_stack_ffffffffffffff48;
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  *this;
  connection *this_00;
  connection *in_stack_ffffffffffffff58;
  undefined1 local_98 [8];
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  *in_stack_ffffffffffffff70;
  CClientUIInterface *in_stack_ffffffffffffff78;
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  local_68;
  connection local_38 [3];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  boost::signals2::connection::disconnect(in_stack_ffffffffffffff58);
  boost::signals2::connection::disconnect(in_stack_ffffffffffffff58);
  boost::signals2::connection::disconnect(in_stack_ffffffffffffff58);
  this_00 = local_38;
  std::function<bool(bilingual_str_const&,std::__cxx11::string_const&,unsigned_int)>::
  function<bool(&)(bilingual_str_const&,std::__cxx11::string_const&,unsigned_int),void>
            (in_stack_ffffffffffffff48,
             (_func_bool_bilingual_str_ptr_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr_uint
              *)in_stack_ffffffffffffff40);
  CClientUIInterface::ThreadSafeMessageBox_connect
            (in_stack_ffffffffffffff78,
             (function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
              *)in_stack_ffffffffffffff70);
  boost::signals2::connection::operator=(this_00,(connection *)in_stack_ffffffffffffff48);
  boost::signals2::connection::~connection((connection *)in_stack_ffffffffffffff38);
  std::
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  ::~function((function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
               *)in_stack_ffffffffffffff38);
  this = &local_68;
  std::
  function<bool(bilingual_str_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int)>
  ::
  function<bool(&)(bilingual_str_const&,std::__cxx11::string_const&,std::__cxx11::string_const&,unsigned_int),void>
            (this,in_stack_ffffffffffffff40);
  CClientUIInterface::ThreadSafeQuestion_connect
            (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70);
  boost::signals2::connection::operator=(this_00,(connection *)this);
  boost::signals2::connection::~connection((connection *)in_stack_ffffffffffffff38);
  std::
  function<bool_(const_bilingual_str_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_int)>
  ::~function(in_stack_ffffffffffffff38);
  std::function<void(std::__cxx11::string_const&)>::
  function<void(&)(std::__cxx11::string_const&),void>
            ((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)this,(_func_void_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
                      *)local_98);
  CClientUIInterface::InitMessage_connect
            (in_stack_ffffffffffffff78,
             (function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)in_stack_ffffffffffffff70);
  boost::signals2::connection::operator=(this_00,(connection *)this);
  boost::signals2::connection::~connection((connection *)in_stack_ffffffffffffff38);
  std::
  function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  ::~function((function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)in_stack_ffffffffffffff38);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void noui_test_redirect()
{
    noui_ThreadSafeMessageBoxConn.disconnect();
    noui_ThreadSafeQuestionConn.disconnect();
    noui_InitMessageConn.disconnect();
    noui_ThreadSafeMessageBoxConn = uiInterface.ThreadSafeMessageBox_connect(noui_ThreadSafeMessageBoxRedirect);
    noui_ThreadSafeQuestionConn = uiInterface.ThreadSafeQuestion_connect(noui_ThreadSafeQuestionRedirect);
    noui_InitMessageConn = uiInterface.InitMessage_connect(noui_InitMessageRedirect);
}